

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O2

void luaV_concat(lua_State *L,int total,int last)

{
  StkId pTVar1;
  Table *pTVar2;
  int iVar3;
  char *str;
  GCObject *pGVar4;
  uint uVar5;
  StkId pTVar6;
  ulong uVar7;
  ulong uVar8;
  Table *pTVar9;
  size_t l;
  StkId p1;
  int iVar10;
  ulong uVar11;
  
  do {
    pTVar1 = L->base;
    pTVar6 = pTVar1 + last;
    p1 = pTVar1 + (long)last + -1;
    if (pTVar1[(long)last + -1].tt - 3U < 2) {
      if (pTVar6->tt != 4) {
        iVar3 = luaV_tostring(L,pTVar6);
        if (iVar3 == 0) goto LAB_00115720;
      }
      pTVar9 = (((pTVar6->value).gc)->h).metatable;
      if (pTVar9 == (Table *)0x0) {
        iVar10 = 1;
        if (pTVar6[-1].tt != 4) {
          luaV_tostring(L,p1);
          goto LAB_00115780;
        }
      }
      else {
        uVar5 = 1;
        if (1 < total) {
          uVar5 = total;
        }
        for (uVar7 = 1; (long)uVar7 < (long)total; uVar7 = uVar7 + 1) {
          if (p1->tt != 4) {
            iVar3 = luaV_tostring(L,p1);
            if (iVar3 == 0) goto LAB_0011578b;
          }
          pTVar2 = (((p1->value).gc)->h).metatable;
          if ((Table *)(-(long)pTVar9 - 3U) <= pTVar2) {
            luaG_runerror(L,"string length overflow");
          }
          pTVar9 = (Table *)((long)&pTVar2->next + (long)&pTVar9->next);
          p1 = p1 + -1;
        }
        uVar7 = (ulong)uVar5;
LAB_0011578b:
        str = luaZ_openspace(L,&L->l_G->buff,(size_t)pTVar9);
        uVar11 = uVar7 & 0xffffffff;
        pTVar6 = pTVar1 + ((long)last - uVar11);
        l = 0;
        for (uVar8 = uVar11; pTVar6 = pTVar6 + 1, 0 < (long)uVar8; uVar8 = uVar8 - 1) {
          pTVar9 = (((pTVar6->value).gc)->h).metatable;
          memcpy(str + l,&(((pTVar6->value).gc)->h).array,(size_t)pTVar9);
          l = (long)&pTVar9->next + l;
        }
        pGVar4 = (GCObject *)luaS_newlstr(L,str,l);
        pTVar1[(long)last + (1 - uVar11)].value.gc = pGVar4;
        pTVar1[(long)last + (1 - uVar11)].tt = 4;
        iVar10 = (int)uVar7 + -1;
      }
    }
    else {
LAB_00115720:
      iVar3 = call_binTM(L,p1,pTVar6,p1,TM_CONCAT);
      iVar10 = 1;
      if (iVar3 == 0) {
        luaG_concaterror(L,p1,pTVar6);
LAB_00115780:
        iVar10 = 1;
      }
    }
    total = total - iVar10;
    last = last - iVar10;
    if (total < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat (lua_State *L, int total, int last) {
  do {
    StkId top = L->base + last + 1;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(top-2) || ttisnumber(top-2)) || !tostring(L, top-1)) {
      if (!call_binTM(L, top-2, top-1, top-2, TM_CONCAT))
        luaG_concaterror(L, top-2, top-1);
    } else if (tsvalue(top-1)->len == 0)  /* second op is empty? */
      (void)tostring(L, top - 2);  /* result is first op (as string) */
    else {
      /* at least two string values; get as many as possible */
      size_t tl = tsvalue(top-1)->len;
      char *buffer;
      int i;
      /* collect total length */
      for (n = 1; n < total && tostring(L, top-n-1); n++) {
        size_t l = tsvalue(top-n-1)->len;
        if (l >= MAX_SIZET - tl) luaG_runerror(L, "string length overflow");
        tl += l;
      }
      buffer = luaZ_openspace(L, &G(L)->buff, tl);
      tl = 0;
      for (i=n; i>0; i--) {  /* concat all strings */
        size_t l = tsvalue(top-i)->len;
        memcpy(buffer+tl, svalue(top-i), l);
        tl += l;
      }
      setsvalue2s(L, top-n, luaS_newlstr(L, buffer, tl));
    }
    total -= n-1;  /* got `n' strings to create 1 new */
    last -= n-1;
  } while (total > 1);  /* repeat until only 1 result left */
}